

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O1

void vkt::Draw::populateSubGroup(TestCaseGroup *testGroup,TestCaseParams caseParams)

{
  int iVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *pDVar5;
  DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams> *pDVar6;
  TestNode *pTVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  pointer pPVar11;
  VkDrawIndexedIndirectCommand *pVVar12;
  pointer pPVar13;
  deUint32 in_R8D;
  undefined4 in_register_00000084;
  deUint32 in_R9D;
  int iVar14;
  string name;
  Random rnd;
  DrawIndirectParams params;
  VkDrawIndexedIndirectCommand *local_3f0;
  long local_3e8;
  VkDrawIndexedIndirectCommand local_3e0;
  allocator<char> local_3c9;
  TestNode *local_3c8;
  TestContext *local_3c0;
  long local_3b8;
  ulong local_3b0;
  long *local_3a8;
  long local_3a0;
  long local_398 [2];
  DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams> *local_388;
  _func_int **local_380;
  ulong local_378;
  TestCaseParams local_370;
  deRandom local_368;
  vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> local_358;
  undefined4 local_340;
  deUint32 local_33c;
  undefined4 uStack_338;
  int iStack_334;
  undefined4 uStack_330;
  long local_320;
  vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> local_318;
  undefined4 local_300;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2f8;
  undefined4 local_2e0;
  deUint32 local_2dc;
  undefined4 uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  undefined4 local_2cc;
  vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> local_2c8;
  VkPrimitiveTopology local_2b0;
  vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_> local_2a8;
  vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> local_290;
  VkPrimitiveTopology local_278;
  vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_> local_270;
  vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> local_258;
  VkPrimitiveTopology local_240;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_238;
  VkIndexType local_220;
  vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
  local_218;
  vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> local_200;
  VkPrimitiveTopology local_1e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e0;
  VkIndexType local_1c8;
  vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
  local_1c0;
  DrawIndexedIndirectParams local_1a8;
  ios_base local_138 [264];
  
  local_370 = caseParams;
  dVar2 = deStringHash((testGroup->super_TestNode).m_name._M_dataplus._M_p);
  deRandom_init(&local_368,dVar2 ^ 0xc2a39f);
  local_3c0 = (testGroup->super_TestNode).m_testCtx;
  local_380 = (_func_int **)&PTR__TestCase_00d4f460;
  local_378 = (ulong)(caseParams.topology - VK_PRIMITIVE_TOPOLOGY_LINE_LIST);
  lVar9 = 0;
  local_3c8 = &testGroup->super_TestNode;
  local_3b0 = (ulong)caseParams >> 0x20;
  do {
    iVar8 = 0;
    iVar14 = 1;
    if ((uint)local_378 < 9) {
      iVar8 = *(int *)(&DAT_00b63cfc + local_378 * 4);
      iVar14 = *(int *)(&DAT_00b63d20 + local_378 * 4);
    }
    iVar1 = *(int *)((long)&(anonymous_namespace)::PRIMITIVE_COUNT + lVar9);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    if (local_370.command < DRAW_COMMAND_TYPE_DRAW_LAST) {
      dVar2 = iVar14 * iVar1 + iVar8;
      switch((ulong)local_370 & 0xffffffff) {
      case 0:
        dVar3 = deRandom_getUint32(&local_368);
        pTVar7 = (TestNode *)operator_new(0xe0);
        iStack_334 = (dVar3 % (iVar1 + 1U)) * iVar14;
        local_358.
        super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_358.
        super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_358.
        super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_340 = (undefined4)local_3b0;
        uStack_338 = 1;
        uStack_330 = 0;
        local_33c = dVar2;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,(char *)local_3a8,&local_3c9);
        local_3f0 = &local_3e0;
        local_3b8 = 0x13;
        local_3f0 = (VkDrawIndexedIndirectCommand *)
                    std::__cxx11::string::_M_create((ulong *)&local_3f0,(ulong)&local_3b8);
        local_3e0.indexCount = (undefined4)local_3b8;
        local_3e0.instanceCount = local_3b8._4_4_;
        *(undefined8 *)local_3f0 = 0x617244646d436b76;
        *(undefined8 *)&local_3f0->firstIndex = 0x6163747365742077;
        *(undefined4 *)((long)&local_3f0->vertexOffset + 3) = 0x2e657361;
        local_3e8 = local_3b8;
        *(char *)((long)&local_3f0->indexCount + local_3b8) = '\0';
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar7,local_3c0,
                   (char *)local_1a8.super_DrawParamsBase.vertices.
                           super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                           ._M_impl.super__Vector_impl_data._M_start,(char *)local_3f0);
        pTVar7->_vptr_TestNode = local_380;
        if (local_3f0 != &local_3e0) {
          operator_delete(local_3f0,local_3e0._0_8_ + 1);
        }
        if (local_1a8.super_DrawParamsBase.vertices.
            super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&local_1a8.super_DrawParamsBase.vertices.
                      super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_1a8.super_DrawParamsBase.vertices.
                          super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)((local_1a8.super_DrawParamsBase.vertices.
                                          super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                        position).m_data + 1));
        }
        pTVar7->_vptr_TestNode = (_func_int **)&PTR__DrawTestCase_00d60ff8;
        std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ::vector((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  *)(pTVar7 + 1),&local_358);
        *(undefined4 *)&pTVar7[1].m_name._M_string_length = local_340;
        *(deUint32 *)((long)&pTVar7[1].m_name._M_string_length + 4) = local_33c;
        *(undefined4 *)&pTVar7[1].m_name.field_2 = uStack_338;
        *(int *)((long)&pTVar7[1].m_name.field_2 + 4) = iStack_334;
        *(undefined4 *)((long)&pTVar7[1].m_name.field_2 + 8) = uStack_330;
        pTVar7[1].m_description._M_dataplus._M_p = (pointer)&pTVar7[1].m_description.field_2;
        pTVar7[1].m_description._M_string_length = 0;
        pTVar7[1].m_description.field_2._M_local_buf[0] = '\0';
        *(pointer **)&pTVar7[1].m_nodeType =
             &pTVar7[1].m_children.
              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
        pTVar7[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        *(undefined1 *)
         &pTVar7[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = 0;
        (*pTVar7->_vptr_TestNode[7])(pTVar7);
        tcu::TestNode::addChild(local_3c8,pTVar7);
        pPVar11 = local_358.
                  super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pPVar13 = local_358.
                  super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_358.
            super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
            ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_0071ffb8;
        goto LAB_0071ffb0;
      case 1:
        dVar3 = deRandom_getUint32(&local_368);
        dVar4 = deRandom_getUint32(&local_368);
        pTVar7 = (TestNode *)operator_new(0x100);
        uStack_2d4 = dVar3 % 0x3e9;
        uStack_2d0 = dVar4 % 0x3e9;
        local_318.
        super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_318.
        super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_318.
        super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_300 = (undefined4)local_3b0;
        local_2f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2e0 = 1;
        uStack_2d8 = 1;
        local_2cc = 0;
        local_2dc = dVar2;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,(char *)local_3a8,&local_3c9);
        local_3f0 = &local_3e0;
        local_3b8 = 0x1a;
        local_3f0 = (VkDrawIndexedIndirectCommand *)
                    std::__cxx11::string::_M_create((ulong *)&local_3f0,(ulong)&local_3b8);
        local_3e0.indexCount = (undefined4)local_3b8;
        local_3e0.instanceCount = local_3b8._4_4_;
        builtin_strncpy((char *)((long)&local_3f0->firstIndex + 2),"ndexed t",8);
        builtin_strncpy((char *)((long)&local_3f0->firstInstance + 2),"estcase.",8);
        *(undefined8 *)local_3f0 = 0x617244646d436b76;
        *(undefined8 *)&local_3f0->firstIndex = 0x64657865646e4977;
        local_3e8 = local_3b8;
        *(char *)((long)&local_3f0->indexCount + local_3b8) = '\0';
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar7,local_3c0,
                   (char *)local_1a8.super_DrawParamsBase.vertices.
                           super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                           ._M_impl.super__Vector_impl_data._M_start,(char *)local_3f0);
        pTVar7->_vptr_TestNode = local_380;
        if (local_3f0 != &local_3e0) {
          operator_delete(local_3f0,local_3e0._0_8_ + 1);
        }
        if (local_1a8.super_DrawParamsBase.vertices.
            super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&local_1a8.super_DrawParamsBase.vertices.
                      super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_1a8.super_DrawParamsBase.vertices.
                          super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)((local_1a8.super_DrawParamsBase.vertices.
                                          super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                        position).m_data + 1));
        }
        pTVar7->_vptr_TestNode = (_func_int **)&PTR__DrawTestCase_00d61150;
        std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ::vector((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  *)(pTVar7 + 1),&local_318);
        *(undefined4 *)&pTVar7[1].m_name._M_string_length = local_300;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pTVar7[1].m_name.field_2,
                   &local_2f8);
        *(undefined4 *)&pTVar7[1].m_description._M_string_length = local_2e0;
        *(deUint32 *)((long)&pTVar7[1].m_description._M_string_length + 4) = local_2dc;
        *(undefined4 *)&pTVar7[1].m_description.field_2 = uStack_2d8;
        *(uint *)((long)&pTVar7[1].m_description.field_2 + 4) = uStack_2d4;
        *(uint *)((long)&pTVar7[1].m_description.field_2 + 8) = uStack_2d0;
        *(undefined4 *)((long)&pTVar7[1].m_description.field_2 + 0xc) = local_2cc;
        *(pointer **)&pTVar7[1].m_nodeType =
             &pTVar7[1].m_children.
              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
        pTVar7[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        *(undefined1 *)
         &pTVar7[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = 0;
        pTVar7[2]._vptr_TestNode = (_func_int **)&pTVar7[2].m_name;
        pTVar7[2].m_testCtx = (TestContext *)0x0;
        *(undefined1 *)&pTVar7[2].m_name._M_dataplus._M_p = 0;
        (*pTVar7->_vptr_TestNode[7])(pTVar7);
        tcu::TestNode::addChild(local_3c8,pTVar7);
        pPVar13 = local_318.
                  super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pPVar11 = local_318.
                  super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (local_2f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_2f8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2f8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          pPVar13 = local_318.
                    super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pPVar11 = local_318.
                    super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        goto joined_r0x0071fd0d;
      case 2:
        dVar3 = deRandom_getUint32(&local_368);
        local_1a8.super_DrawParamsBase.vertices.
        super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1a8.super_DrawParamsBase.vertices.
        super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1a8.super_DrawParamsBase.vertices.
        super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1a8.super_DrawParamsBase.topology = (VkPrimitiveTopology)local_3b0;
        local_1a8.super_IndexedParamsBase.indexes.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1a8.super_IndexedParamsBase.indexes.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1a8.super_IndexedParamsBase.indexes.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        anon_unknown_0::DrawIndirectParams::addCommand
                  ((DrawIndirectParams *)&local_1a8,dVar2,0,0,in_R8D);
        pDVar5 = (DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *)
                 operator_new(0xe8);
        local_3f0 = &local_3e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3f0,local_3a8,(long)local_3a8 + local_3a0);
        std::__cxx11::string::append((char *)&local_3f0);
        pVVar12 = local_3f0;
        std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ::vector(&local_290,
                 (vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  *)&local_1a8);
        local_278 = local_1a8.super_DrawParamsBase.topology;
        std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>::vector
                  (&local_270,
                   (vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_> *)
                   &local_1a8.super_IndexedParamsBase);
        anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::
        DrawTestCase(pDVar5,local_3c0,(char *)pVVar12,(char *)&local_290,
                     (DrawIndirectParams *)CONCAT44(in_register_00000084,in_R8D));
        tcu::TestNode::addChild(local_3c8,(TestNode *)pDVar5);
        if (local_270.
            super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_270.
                          super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_270.
                                super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_270.
                                super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_290.
            super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_290.
                          super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_290.
                                super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_290.
                                super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_3f0 != &local_3e0) {
          operator_delete(local_3f0,local_3e0._0_8_ + 1);
        }
        anon_unknown_0::DrawIndirectParams::addCommand
                  ((DrawIndirectParams *)&local_1a8,dVar2,dVar3 % 0x3e9,dVar3 / 0x3e9,in_R8D);
        pDVar5 = (DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *)
                 operator_new(0xe8);
        local_3f0 = &local_3e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3f0,local_3a8,(long)local_3a8 + local_3a0);
        std::__cxx11::string::append((char *)&local_3f0);
        pVVar12 = local_3f0;
        std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ::vector(&local_2c8,
                 (vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  *)&local_1a8);
        local_2b0 = local_1a8.super_DrawParamsBase.topology;
        std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>::vector
                  (&local_2a8,
                   (vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_> *)
                   &local_1a8.super_IndexedParamsBase);
        anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::
        DrawTestCase(pDVar5,local_3c0,(char *)pVVar12,(char *)&local_2c8,
                     (DrawIndirectParams *)CONCAT44(in_register_00000084,in_R8D));
        tcu::TestNode::addChild(local_3c8,(TestNode *)pDVar5);
        if (local_2a8.
            super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2a8.
                          super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_2a8.
                                super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2a8.
                                super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_2c8.
            super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2c8.
                          super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_2c8.
                                super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2c8.
                                super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_3f0 != &local_3e0) {
          uVar10 = local_3e0._0_8_ + 1;
          pVVar12 = local_3f0;
LAB_0071fce0:
          operator_delete(pVVar12,uVar10);
        }
        break;
      case 3:
        dVar3 = deRandom_getUint32(&local_368);
        dVar4 = deRandom_getUint32(&local_368);
        local_1a8.super_DrawParamsBase.vertices.
        super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1a8.super_DrawParamsBase.vertices.
        super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1a8.super_DrawParamsBase.vertices.
        super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1a8.super_DrawParamsBase.topology = (VkPrimitiveTopology)local_3b0;
        local_1a8.super_IndexedParamsBase.indexes.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1a8.super_IndexedParamsBase.indexes.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1a8.super_IndexedParamsBase.indexes.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1a8.super_IndexedParamsBase.indexType = VK_INDEX_TYPE_UINT32;
        local_1a8.commands.
        super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1a8.commands.
        super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
        ._M_impl.super__Vector_impl_data._M_start = (VkDrawIndexedIndirectCommand *)0x0;
        local_1a8.commands.
        super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        anon_unknown_0::DrawIndexedIndirectParams::addCommand(&local_1a8,dVar2,0,0,in_R8D,in_R9D);
        local_388 = (DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams> *)
                    operator_new(0x108);
        local_3f0 = &local_3e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3f0,local_3a8,(long)local_3a8 + local_3a0);
        std::__cxx11::string::append((char *)&local_3f0);
        pVVar12 = local_3f0;
        std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ::vector(&local_200,
                 (vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  *)&local_1a8);
        local_1e8 = local_1a8.super_DrawParamsBase.topology;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_1e0,&local_1a8.super_IndexedParamsBase.indexes);
        local_1c8 = local_1a8.super_IndexedParamsBase.indexType;
        local_320 = lVar9;
        std::
        vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
        ::vector(&local_1c0,&local_1a8.commands);
        pDVar6 = local_388;
        anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams>::
        DrawTestCase(local_388,local_3c0,(char *)pVVar12,(char *)&local_200,
                     (DrawIndexedIndirectParams *)CONCAT44(in_register_00000084,in_R8D));
        tcu::TestNode::addChild(local_3c8,(TestNode *)pDVar6);
        if (local_1c0.
            super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1c0.
                          super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1c0.
                                super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1c0.
                                super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        lVar9 = local_320;
        if (local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1e0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1e0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_200.
            super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_200.
                          super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_200.
                                super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_200.
                                super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_3f0 != &local_3e0) {
          operator_delete(local_3f0,local_3e0._0_8_ + 1);
        }
        anon_unknown_0::DrawIndexedIndirectParams::addCommand
                  (&local_1a8,dVar2,dVar3 % (0x3e9 - dVar2) + dVar2,dVar4 % (0x3e9 - dVar2) + dVar2,
                   in_R8D,in_R9D);
        pDVar6 = (DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams> *)
                 operator_new(0x108);
        local_3f0 = &local_3e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3f0,local_3a8,(long)local_3a8 + local_3a0);
        std::__cxx11::string::append((char *)&local_3f0);
        pVVar12 = local_3f0;
        std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ::vector(&local_258,
                 (vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  *)&local_1a8);
        local_240 = local_1a8.super_DrawParamsBase.topology;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_238,&local_1a8.super_IndexedParamsBase.indexes);
        local_220 = local_1a8.super_IndexedParamsBase.indexType;
        std::
        vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
        ::vector(&local_218,&local_1a8.commands);
        anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams>::
        DrawTestCase(pDVar6,local_3c0,(char *)pVVar12,(char *)&local_258,
                     (DrawIndexedIndirectParams *)CONCAT44(in_register_00000084,in_R8D));
        tcu::TestNode::addChild(local_3c8,(TestNode *)pDVar6);
        if (local_218.
            super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_218.
                          super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_218.
                                super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_218.
                                super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_238.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_238.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_258.
            super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_258.
                          super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_258.
                                super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_258.
                                super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_3f0 != &local_3e0) {
          operator_delete(local_3f0,local_3e0._0_8_ + 1);
        }
        if (local_1a8.commands.
            super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
            ._M_impl.super__Vector_impl_data._M_start != (VkDrawIndexedIndirectCommand *)0x0) {
          uVar10 = (long)local_1a8.commands.
                         super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                   (long)local_1a8.commands.
                         super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          pVVar12 = local_1a8.commands.
                    super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_0071fce0;
        }
      }
      pPVar13 = local_1a8.super_DrawParamsBase.vertices.
                super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar11 = local_1a8.super_DrawParamsBase.vertices.
                super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_1a8.super_IndexedParamsBase.indexes.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a8.super_IndexedParamsBase.indexes.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1a8.super_IndexedParamsBase.indexes.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a8.super_IndexedParamsBase.indexes.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        pPVar13 = local_1a8.super_DrawParamsBase.vertices.
                  super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pPVar11 = local_1a8.super_DrawParamsBase.vertices.
                  super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
joined_r0x0071fd0d:
      if (pPVar13 != (pointer)0x0) {
LAB_0071ffb0:
        operator_delete(pPVar13,(long)pPVar11 - (long)pPVar13);
      }
    }
LAB_0071ffb8:
    if (local_3a8 != local_398) {
      operator_delete(local_3a8,local_398[0] + 1);
    }
    lVar9 = lVar9 + 4;
    if (lVar9 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

void populateSubGroup (tcu::TestCaseGroup* testGroup, const TestCaseParams caseParams)
{
	de::Random						rnd			(SEED ^ deStringHash(testGroup->getName()));
	tcu::TestContext&				testCtx		= testGroup->getTestContext();
	const DrawCommandType			command		= caseParams.command;
	const vk::VkPrimitiveTopology	topology	= caseParams.topology;

	for (deUint32 primitiveCountIdx = 0; primitiveCountIdx < DE_LENGTH_OF_ARRAY(PRIMITIVE_COUNT); ++primitiveCountIdx)
	{
		const deUint32 primitives = PRIMITIVE_COUNT[primitiveCountIdx];

		deUint32	multiplier	= 1;
		deUint32	offset		= 0;
		// Calculated by Vulkan 23.1
		switch (topology)
		{
			case vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST:													break;
			case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST:						multiplier = 2;				break;
			case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:													break;
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:					multiplier = 3;				break;
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:												break;
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:									offset = 1;	break;
			case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:		multiplier = 4;	offset = 1;	break;
			case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:						offset = 1;	break;
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:	multiplier = 6;				break;
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:	multiplier = 2;				break;
			default:														DE_FATAL("Unsupported topology.");
		}

		const deUint32	vertexCount		= multiplier * primitives + offset;
		std::string		name			= de::toString(primitives);

		switch (command)
		{
			case DRAW_COMMAND_TYPE_DRAW:
			{
				deUint32	firstPrimitive	= rnd.getInt(0, primitives);
				deUint32	firstVertex		= multiplier * firstPrimitive;
				testGroup->addChild(new DrawCase(testCtx, name.c_str(), "vkCmdDraw testcase.",
					DrawParams(topology, vertexCount, 1, firstVertex, 0))
				);
				break;
			}
			case DRAW_COMMAND_TYPE_DRAW_INDEXED:
			{
				deUint32	firstIndex			= rnd.getInt(0, OFFSET_LIMIT);
				deUint32	vertexOffset		= rnd.getInt(0, OFFSET_LIMIT);
				testGroup->addChild(new IndexedCase(testCtx, name.c_str(), "vkCmdDrawIndexed testcase.",
					DrawIndexedParams(topology, vk::VK_INDEX_TYPE_UINT32, vertexCount, 1, firstIndex, vertexOffset, 0))
				);
				break;
			}
			case DRAW_COMMAND_TYPE_DRAW_INDIRECT:
			{
				deUint32	firstVertex		= rnd.getInt(0, OFFSET_LIMIT);

				DrawIndirectParams	params	= DrawIndirectParams(topology);

				params.addCommand(vertexCount, 1, 0, 0);
				testGroup->addChild(new IndirectCase(testCtx, (name + "_single_command").c_str(), "vkCmdDrawIndirect testcase.", params));

				params.addCommand(vertexCount, 1, firstVertex, 0);
				testGroup->addChild(new IndirectCase(testCtx, (name + "_multi_command").c_str(), "vkCmdDrawIndirect testcase.", params));
				break;
			}
			case DRAW_COMMAND_TYPE_DRAW_INDEXED_INDIRECT:
			{
				deUint32	firstIndex		= rnd.getInt(vertexCount, OFFSET_LIMIT);
				deUint32	vertexOffset	= rnd.getInt(vertexCount, OFFSET_LIMIT);

				DrawIndexedIndirectParams	params	= DrawIndexedIndirectParams(topology, vk::VK_INDEX_TYPE_UINT32);
				params.addCommand(vertexCount, 1, 0, 0, 0);
				testGroup->addChild(new IndexedIndirectCase(testCtx, (name + "_single_command").c_str(), "vkCmdDrawIndexedIndirect testcase.", params));

				params.addCommand(vertexCount, 1, firstIndex, vertexOffset, 0);
				testGroup->addChild(new IndexedIndirectCase(testCtx, (name + "_multi_command").c_str(), "vkCmdDrawIndexedIndirect testcase.", params));
				break;
			}
			default:
				DE_FATAL("Unsupported draw command.");
		}
	}
}